

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.cpp
# Opt level: O2

void asn1::readDER(vector<unsigned_char,_std::allocator<unsigned_char>_> *data,
                  vector<asn1::DER,_std::allocator<asn1::DER>_> *v)

{
  uint64_t *this;
  unsigned_short uVar1;
  uint uVar2;
  pair<int,_int> pVar3;
  int size;
  string local_f8;
  undefined1 local_d8 [8];
  MemBuffer mb2;
  DER target;
  MemBuffer mb;
  
  this = &target.value;
  MemBuffer::MemBuffer((MemBuffer *)this,data);
  while (mb.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage <
         mb.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + -target.value) {
    pVar3 = MemBuffer::readDERHead((MemBuffer *)this);
    size = pVar3.second;
    MemBuffer::readBuffer((MemBuffer *)local_d8,(MemBuffer *)this,size);
    target.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    target.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    target.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    target.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    target.tag = '\0';
    target._1_7_ = 0;
    target.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    target.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&target.text._M_string_length;
    target.text._M_dataplus._M_p = (pointer)0x0;
    target.text._M_string_length._0_1_ = 0;
    mb2.readpos._0_1_ = (undefined1)pVar3.first;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &target.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
    target.text.field_2._8_8_ = 0;
    uVar2 = pVar3.first;
    if ((uVar2 & 0xfffffffb) == 0x13) {
      MemBuffer::readString_abi_cxx11_(&local_f8,(MemBuffer *)local_d8,size);
      std::__cxx11::string::operator=
                ((string *)
                 &target.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    else if ((1 < uVar2 - 3) && (uVar2 != 6)) {
      if (uVar2 == 2) {
        if (size == 4) {
          uVar2 = MemBuffer::read<unsigned_int>((MemBuffer *)local_d8);
          target.text.field_2._8_8_ = ZEXT48(uVar2);
        }
        else if (size == 2) {
          uVar1 = MemBuffer::read<unsigned_short>((MemBuffer *)local_d8);
          target.text.field_2._8_8_ = ZEXT28(uVar1);
        }
        else if (size == 1) {
          target.text.field_2._8_8_ =
               ZEXT18(*(byte *)((long)local_d8 +
                               (long)mb2.data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage));
          mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 1;
        }
      }
      else if (0x2f < (int)uVar2) {
        readDER((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,
                (vector<asn1::DER,_std::allocator<asn1::DER>_> *)&target);
      }
    }
    std::vector<asn1::DER,_std::allocator<asn1::DER>_>::push_back(v,(value_type *)&mb2.readpos);
    DER::~DER((DER *)&mb2.readpos);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&target.value);
  return;
}

Assistant:

void readDER(const vector<uint8_t>& data, vector<DER>& v)
{
    MemBuffer mb{data};
    while (!mb.done()) {
        auto p = mb.readDERHead();
        MemBuffer mb2 = mb.readBuffer(p.second);

        DER target;

        target.tag = p.first;
        target.data = mb2.buffer();
        target.value = 0;

        if (p.first == 0x13 || p.first == 0x17) {
            target.text = mb2.readString(p.second);
        } else if (p.first == 0x02) {
            switch (p.second) {
            case 1:
                target.value = mb2.read<uint8_t>();
                break;
            case 2:
                target.value = mb2.read<uint16_t>();
                break;
            case 4:
                target.value = mb2.read<uint32_t>();
                break;
            }
        } else if (p.first == 03 || p.first == 4 || p.first == 6) {
        } else if (p.first >= 0x30) {
            readDER(mb2.buffer(), target.children);
        } else if (p.first == 5) {
        }
        v.push_back(target);
    }
}